

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuaternion.h
# Opt level: O2

btQuaternion shortestArcQuat(btVector3 *v0,btVector3 *v1)

{
  btScalar bVar1;
  float fVar2;
  btVector3 bVar3;
  btQuaternion bVar4;
  btVector3 n;
  btVector3 unused;
  float local_58;
  float local_48;
  float fStack_44;
  btVector3 local_38;
  btVector3 local_20;
  
  bVar3 = btVector3::cross(v0,v1);
  bVar1 = btVector3::dot(v0,v1);
  if (-0.9999999 <= bVar1) {
    fVar2 = bVar1 + 1.0 + bVar1 + 1.0;
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    local_58 = bVar3.m_floats[2];
    local_38.m_floats[1] = 1.0 / fVar2;
    local_38.m_floats[2] = local_58 * local_38.m_floats[1];
    local_48 = bVar3.m_floats[0];
    fStack_44 = bVar3.m_floats[1];
    local_38.m_floats[0] = local_48 * local_38.m_floats[1];
    local_38.m_floats[1] = fStack_44 * local_38.m_floats[1];
    fVar2 = fVar2 * 0.5;
  }
  else {
    btPlaneSpace1<btVector3>(v0,&local_38,&local_20);
    fVar2 = 0.0;
  }
  bVar4.super_btQuadWord.m_floats[1] = local_38.m_floats[1];
  bVar4.super_btQuadWord.m_floats[0] = local_38.m_floats[0];
  bVar4.super_btQuadWord.m_floats[3] = fVar2;
  bVar4.super_btQuadWord.m_floats[2] = local_38.m_floats[2];
  return (btQuaternion)bVar4.super_btQuadWord.m_floats;
}

Assistant:

SIMD_FORCE_INLINE btQuaternion 
shortestArcQuat(const btVector3& v0, const btVector3& v1) // Game Programming Gems 2.10. make sure v0,v1 are normalized
{
	btVector3 c = v0.cross(v1);
	btScalar  d = v0.dot(v1);

	if (d < -1.0 + SIMD_EPSILON)
	{
		btVector3 n,unused;
		btPlaneSpace1(v0,n,unused);
		return btQuaternion(n.x(),n.y(),n.z(),0.0f); // just pick any vector that is orthogonal to v0
	}

	btScalar  s = btSqrt((1.0f + d) * 2.0f);
	btScalar rs = 1.0f / s;

	return btQuaternion(c.getX()*rs,c.getY()*rs,c.getZ()*rs,s * 0.5f);
}